

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall
cfgfile::exception_t<cfgfile::wstring_trait_t>::~exception_t
          (exception_t<cfgfile::wstring_trait_t> *this)

{
  logic_error *in_RDI;
  
  std::__cxx11::wstring::~wstring((wstring *)(in_RDI + 0x10));
  std::logic_error::~logic_error(in_RDI);
  return;
}

Assistant:

~exception_t() noexcept
	{
	}